

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O1

vec_t ImGuizmo::Normalized(vec_t *v)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  vec_t vVar6;
  
  uVar1 = v->x;
  uVar3 = v->y;
  uVar2 = v->z;
  uVar4 = v->w;
  fVar5 = (float)uVar2 * (float)uVar2 + (float)uVar1 * (float)uVar1 + (float)uVar3 * (float)uVar3;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  vVar6.x = (float)uVar1 * fVar5;
  vVar6.y = (float)uVar3 * fVar5;
  vVar6.z = (float)uVar2 * fVar5;
  vVar6.w = (float)uVar4 * fVar5;
  return vVar6;
}

Assistant:

vec_t Normalized(const vec_t& v) { vec_t res; res = v; res.Normalize(); return res; }